

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O1

void __thiscall cnn::SimpleRNNBuilder::new_graph_impl(SimpleRNNBuilder *this,ComputationGraph *cg)

{
  ComputationGraph *g;
  Parameters *p;
  SimpleRNNBuilder *pSVar1;
  ulong uVar2;
  initializer_list<cnn::expr::Expression> __l;
  Expression i_hb;
  Expression i_h2h;
  Expression i_x2h;
  Expression i_l2h;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> vars;
  allocator_type local_c1;
  Parameters *local_c0;
  SimpleRNNBuilder *local_b8;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  *local_b0;
  undefined1 local_a8 [24];
  undefined4 local_90;
  undefined1 local_88 [24];
  undefined4 local_70;
  pointer local_68;
  undefined4 local_60;
  ExecutionEngine *local_58;
  undefined4 local_50;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_48;
  
  local_b0 = &this->param_vars;
  local_c0 = (Parameters *)cg;
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(local_b0);
  if (this->layers != 0) {
    g = (ComputationGraph *)(local_88 + 0x10);
    uVar2 = 0;
    local_b8 = this;
    do {
      p = local_c0;
      expr::parameter((ComputationGraph *)local_88,local_c0);
      expr::parameter((ComputationGraph *)(local_a8 + 0x10),p);
      pSVar1 = local_b8;
      expr::parameter((ComputationGraph *)local_a8,p);
      local_88._16_8_ = local_88._0_8_;
      local_70 = local_88._8_4_;
      local_68 = (pointer)local_a8._16_8_;
      local_60 = local_90;
      local_58 = (ExecutionEngine *)local_a8._0_8_;
      local_50 = local_a8._8_4_;
      __l._M_len = 3;
      __l._M_array = (iterator)g;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                (&local_48,__l,&local_c1);
      if (pSVar1->lagging == true) {
        expr::parameter(g,local_c0);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                  (&local_48,(value_type *)g);
      }
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::push_back(local_b0,&local_48);
      if (local_48.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < pSVar1->layers);
  }
  return;
}

Assistant:

void SimpleRNNBuilder::new_graph_impl(ComputationGraph& cg) {
  param_vars.clear();
  for (unsigned i = 0; i < layers; ++i) {
    Parameters* p_x2h = params[i][X2H];
    Parameters* p_h2h = params[i][H2H];
    Parameters* p_hb = params[i][HB];
    Expression i_x2h =  parameter(cg,p_x2h);
    Expression i_h2h =  parameter(cg,p_h2h);
    Expression i_hb =  parameter(cg,p_hb);
    vector<Expression> vars = {i_x2h, i_h2h, i_hb};

    if (lagging) {
        Parameters* p_l2h = params[i][L2H];
        Expression i_l2h =  parameter(cg,p_l2h);
        vars.push_back(i_l2h);
    }

    param_vars.push_back(vars);
  }
}